

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

int Gia_ManIsoStrashReduceOne(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSupp)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  int iVar8;
  Gia_Obj_t *pGVar9;
  uint uVar10;
  ulong uVar11;
  
  uVar10 = (uint)*(undefined8 *)pObj;
  if ((-1 < (int)uVar10) || ((uVar10 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsCo(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0xd5b,
                  "int Gia_ManIsoStrashReduceOne(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)"
                 );
  }
  uVar1 = vSupp->nSize;
  if ((ulong)uVar1 == 0) {
    uVar10 = uVar10 >> 0x1d & 1;
  }
  else if (uVar1 == 1) {
    uVar10 = uVar10 >> 0x1d & 1 | 2;
  }
  else {
    if (0 < (int)uVar1) {
      piVar4 = vSupp->pArray;
      pVVar5 = pNew->vCis;
      uVar10 = pVVar5->nSize;
      uVar7 = 0;
      uVar11 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar11 = uVar7;
      }
      do {
        if (uVar11 == uVar7) {
LAB_00683bdb:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = pVVar5->pArray[uVar7];
        if (((long)iVar2 < 0) || (pNew->nObjs <= iVar2)) {
LAB_00683bbc:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar6 = pNew->pObjs;
        pGVar9 = (Gia_Obj_t *)((ulong)(pGVar6 + iVar2) & 0xfffffffffffffffe);
        if ((pGVar9 < pGVar6) || (pGVar6 + pNew->nObjs <= pGVar9)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar8 = (int)((ulong)((long)pGVar9 - (long)pGVar6) >> 2);
        if (iVar8 * -0x55555555 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10b,"int Abc_Var2Lit(int, int)");
        }
        uVar10 = piVar4[uVar7];
        if (((int)uVar10 < 0) || (p->vCis->nSize <= (int)uVar10)) goto LAB_00683bdb;
        iVar3 = p->vCis->pArray[uVar10];
        if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_00683bbc;
        p->pObjs[iVar3].Value = ((uint)(pGVar6 + iVar2) & 1) + iVar8 * 0x55555556;
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
    Gia_ManDupHashDfs_rec(pNew,p,pObj + -(*(ulong *)pObj & 0x1fffffff));
    uVar11 = *(ulong *)pObj & 0x1fffffff;
    if ((int)pObj[-uVar11].Value < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10f,"int Abc_LitNotCond(int, int)");
    }
    uVar10 = (uint)(*(ulong *)pObj >> 0x1d) & 1 ^ pObj[-uVar11].Value;
    Gia_ManDupCleanDfs_rec(pObj + -uVar11);
  }
  return uVar10;
}

Assistant:

int Gia_ManIsoStrashReduceOne( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSupp )
{
    int k, iCi, iLit;
    assert( Gia_ObjIsCo(pObj) );
    if ( Vec_IntSize(vSupp) == 0 )
        return Abc_Var2Lit(0, Gia_ObjFaninC0(pObj));
    if ( Vec_IntSize(vSupp) == 1 )
        return Abc_Var2Lit(1, Gia_ObjFaninC0(pObj));
    Vec_IntForEachEntry( vSupp, iCi, k )
        Gia_ManCi(p, iCi)->Value = Gia_Obj2Lit(pNew, Gia_ManCi(pNew, k) );
    Gia_ManDupHashDfs_rec( pNew, p, Gia_ObjFanin0(pObj) );
    iLit = Gia_ObjFanin0Copy(pObj);
    Gia_ManDupCleanDfs_rec( Gia_ObjFanin0(pObj) );
    return iLit;
}